

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_operators.cpp
# Opt level: O0

void __thiscall tst_qpromise_operators::equalTo_void(tst_qpromise_operators *this)

{
  bool bVar1;
  bool local_72;
  bool local_71;
  bool local_70;
  bool local_6f;
  bool local_6e;
  bool local_6d;
  bool local_6c;
  bool local_6b;
  bool local_6a;
  bool local_69 [7];
  bool local_62;
  bool local_61;
  undefined1 local_60 [8];
  QPromise<void> p3;
  QPromise<void> p2;
  undefined1 local_30 [8];
  QPromise<void> p1;
  QPromise<void> p0;
  tst_qpromise_operators *this_local;
  
  QtPromise::QPromise<void>::resolve();
  QtPromise::QPromise<void>::resolve();
  QtPromise::QPromise<void>::QPromise<QtPromise::QPromise<void>&>
            ((QPromise<void> *)&p3.super_QPromiseBase<void>.m_d,(QPromise<void> *)local_30);
  QtPromise::QPromise<void>::QPromise<QtPromise::QPromise<void>&>
            ((QPromise<void> *)local_60,(QPromise<void> *)&p3.super_QPromiseBase<void>.m_d);
  local_61 = QtPromise::QPromiseBase<void>::operator==
                       ((QPromiseBase<void> *)&p1.super_QPromiseBase<void>.m_d,
                        (QPromiseBase<void> *)local_30);
  local_62 = false;
  bVar1 = QTest::qCompare<bool,bool>
                    (&local_61,&local_62,"p0 == p1","false",
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                     ,0xa8);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_69[0] = QtPromise::QPromiseBase<void>::operator==
                            ((QPromiseBase<void> *)&p1.super_QPromiseBase<void>.m_d,
                             (QPromiseBase<void> *)&p3.super_QPromiseBase<void>.m_d);
    local_6a = false;
    bVar1 = QTest::qCompare<bool,bool>
                      (local_69,&local_6a,"p0 == p2","false",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                       ,0xa9);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      local_6b = QtPromise::QPromiseBase<void>::operator==
                           ((QPromiseBase<void> *)&p1.super_QPromiseBase<void>.m_d,
                            (QPromiseBase<void> *)local_60);
      local_6c = false;
      bVar1 = QTest::qCompare<bool,bool>
                        (&local_6b,&local_6c,"p0 == p3","false",
                         "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                         ,0xaa);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        local_6d = QtPromise::QPromiseBase<void>::operator==
                             ((QPromiseBase<void> *)local_30,
                              (QPromiseBase<void> *)&p3.super_QPromiseBase<void>.m_d);
        local_6e = true;
        bVar1 = QTest::qCompare<bool,bool>
                          (&local_6d,&local_6e,"p1 == p2","true",
                           "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                           ,0xab);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          local_6f = QtPromise::QPromiseBase<void>::operator==
                               ((QPromiseBase<void> *)local_30,(QPromiseBase<void> *)local_60);
          local_70 = true;
          bVar1 = QTest::qCompare<bool,bool>
                            (&local_6f,&local_70,"p1 == p3","true",
                             "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                             ,0xac);
          if (((bVar1 ^ 0xffU) & 1) == 0) {
            local_71 = QtPromise::QPromiseBase<void>::operator==
                                 ((QPromiseBase<void> *)&p3.super_QPromiseBase<void>.m_d,
                                  (QPromiseBase<void> *)local_60);
            local_72 = true;
            bVar1 = QTest::qCompare<bool,bool>
                              (&local_71,&local_72,"p2 == p3","true",
                               "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                               ,0xad);
            if (((bVar1 ^ 0xffU) & 1) == 0) {
              local_69[1] = false;
              local_69[2] = false;
              local_69[3] = false;
              local_69[4] = false;
            }
            else {
              local_69[1] = true;
              local_69[2] = false;
              local_69[3] = false;
              local_69[4] = false;
            }
          }
          else {
            local_69[1] = true;
            local_69[2] = false;
            local_69[3] = false;
            local_69[4] = false;
          }
        }
        else {
          local_69[1] = true;
          local_69[2] = false;
          local_69[3] = false;
          local_69[4] = false;
        }
      }
      else {
        local_69[1] = true;
        local_69[2] = false;
        local_69[3] = false;
        local_69[4] = false;
      }
    }
    else {
      local_69[1] = true;
      local_69[2] = false;
      local_69[3] = false;
      local_69[4] = false;
    }
  }
  else {
    local_69[1] = true;
    local_69[2] = false;
    local_69[3] = false;
    local_69[4] = false;
  }
  QtPromise::QPromise<void>::~QPromise((QPromise<void> *)local_60);
  QtPromise::QPromise<void>::~QPromise((QPromise<void> *)&p3.super_QPromiseBase<void>.m_d);
  QtPromise::QPromise<void>::~QPromise((QPromise<void> *)local_30);
  QtPromise::QPromise<void>::~QPromise((QPromise<void> *)&p1.super_QPromiseBase<void>.m_d);
  return;
}

Assistant:

void tst_qpromise_operators::equalTo_void()
{
    auto p0 = QtPromise::QPromise<void>::resolve();
    auto p1 = QtPromise::QPromise<void>::resolve();
    auto p2 = p1;
    auto p3(p2);

    QCOMPARE(p0 == p1, false);
    QCOMPARE(p0 == p2, false);
    QCOMPARE(p0 == p3, false);
    QCOMPARE(p1 == p2, true);
    QCOMPARE(p1 == p3, true);
    QCOMPARE(p2 == p3, true);
}